

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O0

Status google::protobuf::anon_unknown_21::FillDefaults
                 (Edition edition,Message *fixed,Message *overridable)

{
  allocator<google::protobuf::FieldOptions_EditionDefault> *this;
  int iVar1;
  Edition EVar2;
  bool bVar3;
  int iVar4;
  Edition EVar5;
  CppType CVar6;
  Descriptor *pDVar7;
  Descriptor *pDVar8;
  FieldOptions *pFVar9;
  FieldOptions_FeatureSupport *pFVar10;
  Reflection *this_00;
  LogMessage *pLVar11;
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *pRVar12;
  const_iterator __first;
  const_iterator __last;
  pointer this_01;
  Descriptor *in_RCX;
  undefined4 in_register_0000003c;
  char *args;
  char *in_R8;
  basic_string_view<char,_std::char_traits<char>_> args_1;
  undefined1 auVar13 [16];
  string_view sVar14;
  basic_string_view<char,_std::char_traits<char>_> args_3;
  string local_188 [32];
  string_view local_168;
  undefined1 local_158 [16];
  FieldOptions_EditionDefault *local_148;
  __normal_iterator<google::protobuf::FieldOptions_EditionDefault_*,_std::vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>_>
  local_140;
  string *local_138;
  string *def;
  Message *local_128;
  char *local_120;
  __normal_iterator<google::protobuf::FieldOptions_EditionDefault_*,_std::vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>_>
  local_118;
  __normal_iterator<google::protobuf::FieldOptions_EditionDefault_*,_std::vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>_>
  local_110;
  ContainerIter<std::vector<google::protobuf::FieldOptions_EditionDefault>_> first_nonmatch;
  undefined1 local_f0 [8];
  vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
  defaults;
  LogMessage local_d0;
  Voidify local_ba;
  byte local_b9;
  LogMessage local_b8;
  Voidify local_a1;
  Descriptor *local_a0;
  Message *msg;
  FieldDescriptor *field;
  undefined1 local_88 [4];
  int i;
  EditionDefault edition_lookup;
  anon_class_1_0_00000001 comparator;
  LogMessage local_48;
  Voidify local_31;
  Descriptor *local_30;
  Descriptor *descriptor;
  Message *overridable_local;
  Message *fixed_local;
  char *pcStack_10;
  Edition edition_local;
  
  args = (char *)CONCAT44(in_register_0000003c,edition);
  fixed_local._4_4_ = (Edition)fixed;
  descriptor = in_RCX;
  overridable_local = overridable;
  pcStack_10 = args;
  pDVar7 = Message::GetDescriptor(overridable);
  local_30 = pDVar7;
  pDVar8 = Message::GetDescriptor((Message *)descriptor);
  if (pDVar7 != pDVar8) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver.cc"
               ,0x120,"&descriptor == overridable.GetDescriptor()");
    pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar11);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_48);
  }
  FieldOptions_EditionDefault::FieldOptions_EditionDefault((FieldOptions_EditionDefault *)local_88);
  FieldOptions_EditionDefault::set_edition
            ((FieldOptions_EditionDefault *)local_88,fixed_local._4_4_);
  field._4_4_ = 0;
  while( true ) {
    iVar1 = field._4_4_;
    iVar4 = Descriptor::field_count(local_30);
    if (iVar4 <= iVar1) break;
    msg = (Message *)Descriptor::field(local_30,field._4_4_);
    local_a0 = descriptor;
    pFVar9 = FieldDescriptor::options((FieldDescriptor *)msg);
    bVar3 = FieldOptions::has_feature_support(pFVar9);
    if (bVar3) {
      pFVar9 = FieldDescriptor::options((FieldDescriptor *)msg);
      pFVar10 = FieldOptions::feature_support(pFVar9);
      bVar3 = FieldOptions_FeatureSupport::has_edition_introduced(pFVar10);
      EVar2 = fixed_local._4_4_;
      if (bVar3) {
        pFVar9 = FieldDescriptor::options((FieldDescriptor *)msg);
        pFVar10 = FieldOptions::feature_support(pFVar9);
        EVar5 = FieldOptions_FeatureSupport::edition_introduced(pFVar10);
        if ((int)EVar5 <= (int)EVar2) goto LAB_002ecc0c;
LAB_002ecc85:
        local_a0 = (Descriptor *)overridable_local;
      }
      else {
LAB_002ecc0c:
        pFVar9 = FieldDescriptor::options((FieldDescriptor *)msg);
        pFVar10 = FieldOptions::feature_support(pFVar9);
        bVar3 = FieldOptions_FeatureSupport::has_edition_removed(pFVar10);
        EVar2 = fixed_local._4_4_;
        if (bVar3) {
          pFVar9 = FieldDescriptor::options((FieldDescriptor *)msg);
          pFVar10 = FieldOptions::feature_support(pFVar9);
          EVar5 = FieldOptions_FeatureSupport::edition_removed(pFVar10);
          if ((int)EVar5 <= (int)EVar2) goto LAB_002ecc85;
        }
      }
    }
    this_00 = Message::GetReflection((Message *)local_a0);
    Reflection::ClearField(this_00,(Message *)local_a0,(FieldDescriptor *)msg);
    local_b9 = 0;
    bVar3 = FieldDescriptor::is_repeated((FieldDescriptor *)msg);
    if (bVar3) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver.cc"
                 ,0x136,"!field.is_repeated()");
      local_b9 = 1;
      pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_a1,pLVar11);
    }
    if ((local_b9 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_b8);
    }
    defaults.
    super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    CVar6 = FieldDescriptor::cpp_type((FieldDescriptor *)msg);
    if (CVar6 == CPPTYPE_MESSAGE) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver.cc"
                 ,0x137,"field.cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE");
      defaults.
      super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_d0);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_ba,pLVar11);
    }
    if ((defaults.
         super__Vector_base<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_d0);
    }
    pFVar9 = FieldDescriptor::options((FieldDescriptor *)msg);
    pRVar12 = FieldOptions::edition_defaults(pFVar9);
    __first = RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault>::begin(pRVar12);
    pFVar9 = FieldDescriptor::options((FieldDescriptor *)msg);
    pRVar12 = FieldOptions::edition_defaults(pFVar9);
    __last = RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault>::end(pRVar12);
    this = (allocator<google::protobuf::FieldOptions_EditionDefault> *)
           ((long)&first_nonmatch._M_current + 7);
    std::allocator<google::protobuf::FieldOptions_EditionDefault>::allocator(this);
    std::
    vector<google::protobuf::FieldOptions_EditionDefault,std::allocator<google::protobuf::FieldOptions_EditionDefault>>
    ::
    vector<google::protobuf::internal::RepeatedPtrIterator<google::protobuf::FieldOptions_EditionDefault_const>,void>
              ((vector<google::protobuf::FieldOptions_EditionDefault,std::allocator<google::protobuf::FieldOptions_EditionDefault>>
                *)local_f0,
               (RepeatedPtrIterator<const_google::protobuf::FieldOptions_EditionDefault>)__first.it_
               ,(RepeatedPtrIterator<const_google::protobuf::FieldOptions_EditionDefault>)__last.it_
               ,this);
    std::allocator<google::protobuf::FieldOptions_EditionDefault>::~allocator
              ((allocator<google::protobuf::FieldOptions_EditionDefault> *)
               ((long)&first_nonmatch._M_current + 7));
    absl::lts_20250127::
    c_sort<std::vector<google::protobuf::FieldOptions_EditionDefault,std::allocator<google::protobuf::FieldOptions_EditionDefault>>,google::protobuf::(anonymous_namespace)::FillDefaults(google::protobuf::Edition,google::protobuf::Message&,google::protobuf::Message&)::__0&>
              ((vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                *)local_f0,(anon_class_1_0_00000001 *)((long)&edition_lookup.field_0 + 0x13));
    local_110._M_current =
         (FieldOptions_EditionDefault *)
         absl::lts_20250127::
         c_upper_bound<std::vector<google::protobuf::FieldOptions_EditionDefault,std::allocator<google::protobuf::FieldOptions_EditionDefault>>,google::protobuf::FieldOptions_EditionDefault,google::protobuf::(anonymous_namespace)::FillDefaults(google::protobuf::Edition,google::protobuf::Message&,google::protobuf::Message&)::__0&>
                   ((vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                     *)local_f0,(FieldOptions_EditionDefault *)local_88,
                    (anon_class_1_0_00000001 *)((long)&edition_lookup.field_0 + 0x13));
    local_118._M_current =
         (FieldOptions_EditionDefault *)
         std::
         vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
         ::begin((vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
                  *)local_f0);
    bVar3 = __gnu_cxx::operator==(&local_110,&local_118);
    EVar2 = fixed_local._4_4_;
    if (bVar3) {
      sVar14 = FieldDescriptor::full_name((FieldDescriptor *)msg);
      local_120 = sVar14._M_str;
      in_R8 = (char *)sVar14._M_len;
      args_3._M_str = in_R8;
      args_3._M_len = (size_t)" in feature field ";
      local_128 = (Message *)in_R8;
      (anonymous_namespace)::
      Error<char_const*,google::protobuf::Edition,char_const*,std::basic_string_view<char,std::char_traits<char>>>
                (args,0x64fe11,(char *)(ulong)EVar2,args_3);
      def._4_4_ = 1;
    }
    else {
      local_148 = local_110._M_current;
      local_140 = std::
                  prev<__gnu_cxx::__normal_iterator<google::protobuf::FieldOptions_EditionDefault*,std::vector<google::protobuf::FieldOptions_EditionDefault,std::allocator<google::protobuf::FieldOptions_EditionDefault>>>>
                            (local_110,1);
      this_01 = __gnu_cxx::
                __normal_iterator<google::protobuf::FieldOptions_EditionDefault_*,_std::vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>_>
                ::operator->(&local_140);
      local_138 = FieldOptions_EditionDefault::value_abi_cxx11_(this_01);
      auVar13 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_138);
      sVar14._M_str = (char *)msg;
      sVar14._M_len = auVar13._8_8_;
      local_158 = auVar13;
      bVar3 = TextFormat::ParseFieldValueFromString
                        (auVar13._0_8_,sVar14,(FieldDescriptor *)local_a0,(Message *)in_R8);
      if (bVar3) {
        def._4_4_ = 0;
      }
      else {
        sVar14 = FieldDescriptor::full_name((FieldDescriptor *)msg);
        local_168 = sVar14;
        std::__cxx11::string::string(local_188,(string *)local_138);
        in_R8 = ". Could not parse: ";
        args_1._M_str = (char *)local_168._M_len;
        args_1._M_len = (size_t)"Parsing error in edition_defaults for feature field ";
        (anonymous_namespace)::
        Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*,std::__cxx11::string>
                  (args,args_1,local_168._M_str,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ". Could not parse: ");
        std::__cxx11::string::~string(local_188);
        def._4_4_ = 1;
      }
    }
    std::
    vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
    ::~vector((vector<google::protobuf::FieldOptions_EditionDefault,_std::allocator<google::protobuf::FieldOptions_EditionDefault>_>
               *)local_f0);
    if (def._4_4_ != 0) goto LAB_002ed1f6;
    field._4_4_ = field._4_4_ + 1;
  }
  absl::lts_20250127::OkStatus();
  def._4_4_ = 1;
LAB_002ed1f6:
  FieldOptions_EditionDefault::~FieldOptions_EditionDefault((FieldOptions_EditionDefault *)local_88)
  ;
  return (Status)(uintptr_t)args;
}

Assistant:

absl::Status FillDefaults(Edition edition, Message& fixed,
                          Message& overridable) {
  const Descriptor& descriptor = *fixed.GetDescriptor();
  ABSL_CHECK(&descriptor == overridable.GetDescriptor());

  auto comparator = [](const FieldOptions::EditionDefault& a,
                       const FieldOptions::EditionDefault& b) {
    return a.edition() < b.edition();
  };
  FieldOptions::EditionDefault edition_lookup;
  edition_lookup.set_edition(edition);

  for (int i = 0; i < descriptor.field_count(); ++i) {
    const FieldDescriptor& field = *descriptor.field(i);
    Message* msg = &overridable;
    if (field.options().has_feature_support()) {
      if ((field.options().feature_support().has_edition_introduced() &&
           edition < field.options().feature_support().edition_introduced()) ||
          (field.options().feature_support().has_edition_removed() &&
           edition >= field.options().feature_support().edition_removed())) {
        msg = &fixed;
      }
    }

    msg->GetReflection()->ClearField(msg, &field);
    ABSL_CHECK(!field.is_repeated());
    ABSL_CHECK(field.cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE);

    std::vector<FieldOptions::EditionDefault> defaults{
        field.options().edition_defaults().begin(),
        field.options().edition_defaults().end()};
    absl::c_sort(defaults, comparator);
    auto first_nonmatch =
        absl::c_upper_bound(defaults, edition_lookup, comparator);
    if (first_nonmatch == defaults.begin()) {
      return Error("No valid default found for edition ", edition,
                   " in feature field ", field.full_name());
    }

    const std::string& def = std::prev(first_nonmatch)->value();
    if (!TextFormat::ParseFieldValueFromString(def, &field, msg)) {
      return Error("Parsing error in edition_defaults for feature field ",
                   field.full_name(), ". Could not parse: ", def);
    }
  }

  return absl::OkStatus();
}